

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

bool __thiscall Clasp::ClaspFacade::SolveStrategy::setModel(SolveStrategy *this,Solver *s,Model *m)

{
  EventHandler *pEVar1;
  LogPtr pEVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  
  (this->result_).flags = (this->result_).flags | 1;
  pEVar1 = this->handler_;
  bVar5 = 1;
  bVar4 = 1;
  if (pEVar1 != (EventHandler *)0x0) {
    iVar3 = (*(pEVar1->super_ModelHandler)._vptr_ModelHandler[2])(pEVar1,s,m);
    bVar4 = (byte)iVar3;
  }
  pEVar2 = s->shared_->progress_;
  if (pEVar2 != (LogPtr)0x0) {
    iVar3 = (*(pEVar2->super_ModelHandler)._vptr_ModelHandler[2])(pEVar2,s,m);
    bVar5 = (byte)iVar3;
  }
  if (((this->mode_).val_ & Yield) != Default) {
    (*this->_vptr_SolveStrategy[4])(this,1);
  }
  if ((bVar4 & bVar5) == 0) {
    bVar6 = false;
  }
  else {
    bVar6 = (this->signal_).super___atomic_base<unsigned_int>._M_i == 0;
  }
  return bVar6;
}

Assistant:

bool setModel(const Solver& s, const Model& m) {
		result_.flags |= SolveResult::SAT;
		bool ok = !handler_ || handler_->onModel(s, m);
		ok      = s.sharedContext()->report(s, m) && ok;
		if ((mode_ & SolveMode_t::Yield) != 0) { doNotify(event_model); }
		return ok && !signal();
	}